

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraInd.c
# Opt level: O1

Aig_Man_t * Fra_FraigInductionPart(Aig_Man_t *pAig,Fra_Ssw_t *pPars)

{
  uint uVar1;
  Vec_Int_t *pVVar2;
  int iVar3;
  uint uVar4;
  Vec_Ptr_t *vResult;
  void **ppvVar5;
  Vec_Vec_t *pVVar6;
  int *piVar7;
  void *pvVar8;
  Aig_Man_t *pAVar9;
  Vec_Ptr_t *pVVar10;
  Aig_Man_t *p;
  long lVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  int *pMapBack;
  int local_5c;
  int nCountRegs;
  int nCountPis;
  long local_50;
  timespec ts;
  
  iVar3 = clock_gettime(3,(timespec *)&ts);
  if (iVar3 < 0) {
    local_50 = 1;
  }
  else {
    lVar11 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
    local_50 = ((lVar11 >> 7) - (lVar11 >> 0x3f)) + ts.tv_sec * -1000000;
  }
  iVar3 = pPars->nPartSize;
  iVar12 = pPars->fVerbose;
  pPars->nPartSize = 0;
  pPars->fVerbose = 0;
  local_5c = iVar3;
  if (pAig->vClockDoms == (Vec_Vec_t *)0x0) {
    vResult = Aig_ManRegPartitionSimple(pAig,iVar3,pPars->nOverSize);
  }
  else {
    vResult = (Vec_Ptr_t *)malloc(0x10);
    vResult->nCap = 100;
    vResult->nSize = 0;
    ppvVar5 = (void **)malloc(800);
    vResult->pArray = ppvVar5;
    pVVar6 = pAig->vClockDoms;
    if (0 < pVVar6->nSize) {
      lVar11 = 0;
      do {
        pVVar2 = (Vec_Int_t *)pVVar6->pArray[lVar11];
        if ((iVar3 == 0) || (pVVar2->nSize <= iVar3)) {
          piVar7 = (int *)malloc(0x10);
          iVar13 = pVVar2->nSize;
          lVar14 = (long)iVar13;
          piVar7[1] = iVar13;
          *piVar7 = iVar13;
          if (lVar14 == 0) {
            pvVar8 = (void *)0x0;
          }
          else {
            pvVar8 = malloc(lVar14 * 4);
          }
          *(void **)(piVar7 + 2) = pvVar8;
          memcpy(pvVar8,pVVar2->pArray,lVar14 << 2);
          uVar4 = vResult->nCap;
          if (vResult->nSize == uVar4) {
            if ((int)uVar4 < 0x10) {
              if (vResult->pArray == (void **)0x0) {
                ppvVar5 = (void **)malloc(0x80);
              }
              else {
                ppvVar5 = (void **)realloc(vResult->pArray,0x80);
              }
              iVar13 = 0x10;
            }
            else {
              iVar13 = uVar4 * 2;
              if (iVar13 <= (int)uVar4) goto LAB_005fcf6a;
              if (vResult->pArray == (void **)0x0) {
                ppvVar5 = (void **)malloc((ulong)uVar4 << 4);
              }
              else {
                ppvVar5 = (void **)realloc(vResult->pArray,(ulong)uVar4 << 4);
              }
            }
            vResult->pArray = ppvVar5;
            vResult->nCap = iVar13;
          }
LAB_005fcf6a:
          iVar13 = vResult->nSize;
          vResult->nSize = iVar13 + 1;
          vResult->pArray[iVar13] = piVar7;
        }
        else {
          Aig_ManPartDivide(vResult,pVVar2,iVar3,pPars->nOverSize);
        }
        lVar11 = lVar11 + 1;
        pVVar6 = pAig->vClockDoms;
      } while (lVar11 < pVVar6->nSize);
    }
  }
  Aig_ManReprStart(pAig,pAig->vObjs->nSize);
  if (0 < vResult->nSize) {
    uVar15 = 0;
    do {
      pVVar2 = (Vec_Int_t *)vResult->pArray[uVar15];
      pAVar9 = Aig_ManRegCreatePart(pAig,pVVar2,&nCountPis,&nCountRegs,&pMapBack);
      if (pAig->vOnehots != (Vec_Ptr_t *)0x0) {
        pVVar10 = Aig_ManRegProjectOnehots(pAig,pAVar9,pAig->vOnehots,iVar12);
        pAVar9->vOnehots = pVVar10;
      }
      p = Fra_FraigInduction(pAVar9,pPars);
      uVar4 = Aig_TransferMappedClasses(pAig,pAVar9,pMapBack);
      if (iVar12 != 0) {
        uVar1 = pVVar2->nSize;
        printf("%3d : Reg = %4d. PI = %4d. (True = %4d. Regs = %4d.) And = %5d. It = %3d. Cl = %5d.\n"
               ,uVar15 & 0xffffffff,(ulong)uVar1,(ulong)(pAVar9->nObjs[2] - uVar1),
               (ulong)(uint)nCountPis,(ulong)(uint)nCountRegs,
               (ulong)(uint)(pAVar9->nObjs[6] + pAVar9->nObjs[5]),(ulong)(uint)pPars->nIters,
               (ulong)uVar4);
      }
      Aig_ManStop(p);
      Aig_ManStop(pAVar9);
      if (pMapBack != (int *)0x0) {
        free(pMapBack);
        pMapBack = (int *)0x0;
      }
      uVar15 = uVar15 + 1;
    } while ((long)uVar15 < (long)vResult->nSize);
  }
  pAVar9 = Aig_ManDupRepr(pAig,0);
  Aig_ManSeqCleanup(pAVar9);
  if (0 < vResult->nSize) {
    lVar11 = 0;
    do {
      pvVar8 = vResult->pArray[lVar11];
      if (pvVar8 != (void *)0x0) {
        if (*(void **)((long)pvVar8 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar8 + 8));
          *(undefined8 *)((long)pvVar8 + 8) = 0;
        }
        free(pvVar8);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < vResult->nSize);
  }
  iVar3 = local_5c;
  ppvVar5 = vResult->pArray;
  if (ppvVar5 != (void **)0x0) {
    free(ppvVar5);
    vResult->pArray = (void **)0x0;
  }
  iVar13 = (int)ppvVar5;
  if (vResult != (Vec_Ptr_t *)0x0) {
    free(vResult);
    iVar13 = (int)vResult;
  }
  pPars->nPartSize = iVar3;
  pPars->fVerbose = iVar12;
  if (iVar12 != 0) {
    Abc_Print(iVar13,"%s =","Total time");
    iVar12 = 3;
    iVar3 = clock_gettime(3,(timespec *)&ts);
    if (iVar3 < 0) {
      lVar11 = -1;
    }
    else {
      lVar11 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
    }
    Abc_Print(iVar12,"%9.2f sec\n",(double)(lVar11 + local_50) / 1000000.0);
  }
  return pAVar9;
}

Assistant:

Aig_Man_t * Fra_FraigInductionPart( Aig_Man_t * pAig, Fra_Ssw_t * pPars )
{
    int fPrintParts = 0;
    char Buffer[100];
    Aig_Man_t * pTemp, * pNew;
    Vec_Ptr_t * vResult;
    Vec_Int_t * vPart;
    int * pMapBack;
    int i, nCountPis, nCountRegs;
    int nClasses, nPartSize, fVerbose;
    abctime clk = Abc_Clock();

    // save parameters
    nPartSize = pPars->nPartSize; pPars->nPartSize = 0;
    fVerbose  = pPars->fVerbose;  pPars->fVerbose = 0;
    // generate partitions
    if ( pAig->vClockDoms )
    {
        // divide large clock domains into separate partitions
        vResult = Vec_PtrAlloc( 100 );
        Vec_PtrForEachEntry( Vec_Int_t *, (Vec_Ptr_t *)pAig->vClockDoms, vPart, i )
        {
            if ( nPartSize && Vec_IntSize(vPart) > nPartSize )
                Aig_ManPartDivide( vResult, vPart, nPartSize, pPars->nOverSize );
            else
                Vec_PtrPush( vResult, Vec_IntDup(vPart) );
        }
    }
    else
        vResult = Aig_ManRegPartitionSimple( pAig, nPartSize, pPars->nOverSize );
//    vResult = Aig_ManPartitionSmartRegisters( pAig, nPartSize, 0 ); 
//    vResult = Aig_ManRegPartitionSmart( pAig, nPartSize );
    if ( fPrintParts )
    {
        // print partitions
        printf( "Simple partitioning. %d partitions are saved:\n", Vec_PtrSize(vResult) );
        Vec_PtrForEachEntry( Vec_Int_t *, vResult, vPart, i )
        {
            sprintf( Buffer, "part%03d.aig", i );
            pTemp = Aig_ManRegCreatePart( pAig, vPart, &nCountPis, &nCountRegs, NULL );
            Ioa_WriteAiger( pTemp, Buffer, 0, 0 );
            printf( "part%03d.aig : Reg = %4d. PI = %4d. (True = %4d. Regs = %4d.) And = %5d.\n", 
                i, Vec_IntSize(vPart), Aig_ManCiNum(pTemp)-Vec_IntSize(vPart), nCountPis, nCountRegs, Aig_ManNodeNum(pTemp) );
            Aig_ManStop( pTemp );
        }
    }

    // perform SSW with partitions
    Aig_ManReprStart( pAig, Aig_ManObjNumMax(pAig) );
    Vec_PtrForEachEntry( Vec_Int_t *, vResult, vPart, i )
    {
        pTemp = Aig_ManRegCreatePart( pAig, vPart, &nCountPis, &nCountRegs, &pMapBack );
        // create the projection of 1-hot registers
        if ( pAig->vOnehots )
            pTemp->vOnehots = Aig_ManRegProjectOnehots( pAig, pTemp, pAig->vOnehots, fVerbose );
        // run SSW
        pNew = Fra_FraigInduction( pTemp, pPars );
        nClasses = Aig_TransferMappedClasses( pAig, pTemp, pMapBack );
        if ( fVerbose )
            printf( "%3d : Reg = %4d. PI = %4d. (True = %4d. Regs = %4d.) And = %5d. It = %3d. Cl = %5d.\n", 
                i, Vec_IntSize(vPart), Aig_ManCiNum(pTemp)-Vec_IntSize(vPart), nCountPis, nCountRegs, Aig_ManNodeNum(pTemp), pPars->nIters, nClasses );
        Aig_ManStop( pNew );
        Aig_ManStop( pTemp );
        ABC_FREE( pMapBack );
    }
    // remap the AIG
    pNew = Aig_ManDupRepr( pAig, 0 );
    Aig_ManSeqCleanup( pNew );
//    Aig_ManPrintStats( pAig );
//    Aig_ManPrintStats( pNew );
    Vec_VecFree( (Vec_Vec_t *)vResult );
    pPars->nPartSize = nPartSize;
    pPars->fVerbose = fVerbose;
    if ( fVerbose )
    {
        ABC_PRT( "Total time", Abc_Clock() - clk );
    }
    return pNew;
}